

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O1

GLubyte * glewGetErrorString(GLenum error)

{
  ulong uVar1;
  
  uVar1 = 4;
  if (error < 4) {
    uVar1 = (ulong)error;
  }
  return glewGetErrorString__glewErrorString_rel +
         *(int *)(glewGetErrorString__glewErrorString_rel + uVar1 * 4);
}

Assistant:

const GLubyte * GLEWAPIENTRY glewGetErrorString (GLenum error)
{
  static const GLubyte* _glewErrorString[] =
  {
    (const GLubyte*)"No error",
    (const GLubyte*)"Missing GL version",
    (const GLubyte*)"GL 1.1 and up are not supported",
    (const GLubyte*)"GLX 1.2 and up are not supported",
    (const GLubyte*)"Unknown error"
  };
  const size_t max_error = sizeof(_glewErrorString)/sizeof(*_glewErrorString) - 1;
  return _glewErrorString[(size_t)error > max_error ? max_error : (size_t)error];
}